

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::changeEvent(QLabel *this,QEvent *ev)

{
  Type TVar1;
  QLabelPrivate *this_00;
  QEvent *in_RSI;
  QWidget *in_RDI;
  QLabelPrivate *d;
  QPalette *in_stack_ffffffffffffffc8;
  QWidgetTextControl *in_stack_ffffffffffffffd0;
  QWidget *this_01;
  QTextDocument *in_stack_ffffffffffffffd8;
  
  this_00 = d_func((QLabel *)0x5b2f81);
  TVar1 = QEvent::type(in_RSI);
  if ((TVar1 == FontChange) || (TVar1 = QEvent::type(in_RSI), TVar1 == ApplicationFontChange)) {
    if ((*(ushort *)&this_00->field_0x340 >> 4 & 1) != 0) {
      if (this_00->control != (QWidgetTextControl *)0x0) {
        in_stack_ffffffffffffffd8 = QWidgetTextControl::document(in_stack_ffffffffffffffd0);
        QWidget::font(in_RDI);
        QTextDocument::setDefaultFont((QFont *)in_stack_ffffffffffffffd8);
      }
      QLabelPrivate::updateLabel(this_00);
    }
  }
  else {
    TVar1 = QEvent::type(in_RSI);
    if ((TVar1 == PaletteChange) && (this_00->control != (QWidgetTextControl *)0x0)) {
      this_01 = (QWidget *)this_00->control;
      QWidget::palette(this_01);
      QWidgetTextControl::setPalette((QWidgetTextControl *)this_01,in_stack_ffffffffffffffc8);
    }
    else {
      TVar1 = QEvent::type(in_RSI);
      if (TVar1 == ContentsRectChange) {
        QLabelPrivate::updateLabel(this_00);
      }
    }
  }
  QFrame::changeEvent((QFrame *)in_RDI,(QEvent *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QLabel::changeEvent(QEvent *ev)
{
    Q_D(QLabel);
    if (ev->type() == QEvent::FontChange || ev->type() == QEvent::ApplicationFontChange) {
        if (d->isTextLabel) {
            if (d->control)
                d->control->document()->setDefaultFont(font());
            d->updateLabel();
        }
    } else if (ev->type() == QEvent::PaletteChange && d->control) {
        d->control->setPalette(palette());
    } else if (ev->type() == QEvent::ContentsRectChange) {
        d->updateLabel();
    }
    QFrame::changeEvent(ev);
}